

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::info<char[14],char[10]>
          (ConsoleLogger *this,char (*args) [14],char (*args_1) [10])

{
  char (*args_local_1) [10];
  char (*args_local) [14];
  ConsoleLogger *this_local;
  
  if (this->loglevel < 2) {
    std::mutex::lock(&this->mtx);
    if ((this->colored & 1U) != 0) {
      std::operator<<(this->out,(string *)&this->infoColor);
    }
    std::operator<<(this->out,"[i] ");
    if ((this->colored & 1U) != 0) {
      std::operator<<(this->out,"\x1b[0m");
    }
    print<char[14],char[10]>(this,args,args_1);
    std::mutex::unlock(&this->mtx);
  }
  return;
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}